

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

Unit * Lib::List<Kernel::Unit_*>::pop(List<Kernel::Unit_*> **lst)

{
  List<Kernel::Unit_*> *ptr;
  Unit *pUVar1;
  List<Kernel::Unit_*> *pLVar2;
  
  ptr = *lst;
  pUVar1 = ptr->_head;
  pLVar2 = ptr->_tail;
  List<Kernel::Unit*>::operator_delete(ptr,0x10);
  *lst = pLVar2;
  return pUVar1;
}

Assistant:

static C pop(List* &lst)
  {
    ASS_NEQ(lst,0);

    List* tail = lst->tail();
    C result = lst->head();
    delete lst;
    lst = tail;

    return result;
  }